

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  CpuRegisters *pCVar10;
  IMos6502 *pIVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  uint *puVar13;
  IMmu *pIVar14;
  IPpu *pIVar15;
  uint64_t uVar16;
  long lVar17;
  char *pcVar18;
  Family family;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  ulong uVar19;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  string_view sVar20;
  string_view format_str;
  string_view format_str_00;
  string memory_string;
  string opcode_string;
  string execution_string;
  CpuState state;
  Nes nes;
  ifstream fs;
  string local_3b8;
  string local_398;
  pointer local_378;
  size_type sStack_370;
  ulong local_368;
  ulong local_358;
  long local_348;
  string local_330;
  long local_310;
  ulong local_308;
  ulong local_300;
  string local_2f8;
  string local_2d8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  Nes local_288;
  istream local_238 [520];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (argc == 2) {
    n_e_s::nes::Nes::Nes(&local_288);
    std::ifstream::ifstream(local_238,argv[1],_S_bin);
    n_e_s::nes::Nes::load_rom(&local_288,local_238);
    pCVar10 = n_e_s::nes::Nes::cpu_registers(&local_288);
    pCVar10->pc = 0xc000;
    uVar19 = 0;
    lVar17 = 0;
    do {
      n_e_s::nes::Nes::execute(&local_288);
      n_e_s::nes::Nes::execute(&local_288);
      n_e_s::nes::Nes::execute(&local_288);
      n_e_s::nes::Nes::execute(&local_288);
      pIVar11 = n_e_s::nes::Nes::cpu(&local_288);
      iVar4 = (*(pIVar11->super_ICpu)._vptr_ICpu[4])(pIVar11);
      lVar2 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x18);
      if (((int)uVar19 == 0) || (lVar17 != lVar2)) {
        local_310 = lVar2;
        local_308 = uVar19;
        pIVar11 = n_e_s::nes::Nes::cpu(&local_288);
        iVar4 = (*(pIVar11->super_ICpu)._vptr_ICpu[4])(pIVar11);
        puVar12 = (undefined8 *)CONCAT44(extraout_var_00,iVar4);
        local_298 = puVar12[4];
        local_2b8 = *puVar12;
        uStack_2b0 = puVar12[1];
        local_2a8 = puVar12[2];
        uStack_2a0 = puVar12[3];
        pIVar11 = n_e_s::nes::Nes::cpu(&local_288);
        iVar4 = (*(pIVar11->super_ICpu)._vptr_ICpu[4])(pIVar11);
        puVar13 = (uint *)CONCAT44(extraout_var_01,iVar4);
        local_300 = (ulong)*puVar13;
        uVar9 = puVar13[1];
        uVar8 = puVar13[2];
        uVar1 = (ushort)puVar13[4];
        pIVar14 = n_e_s::nes::Nes::mmu(&local_288);
        uVar5 = (*pIVar14->_vptr_IMmu[3])(pIVar14,(ulong)uVar1);
        pIVar14 = n_e_s::nes::Nes::mmu(&local_288);
        uVar6 = (*pIVar14->_vptr_IMmu[3])
                          (pIVar14,(ulong)(ushort)(uVar1 + 1),pIVar14->_vptr_IMmu,(ulong)(uVar1 + 1)
                          );
        pIVar14 = n_e_s::nes::Nes::mmu(&local_288);
        uVar7 = (*pIVar14->_vptr_IMmu[3])
                          (pIVar14,(ulong)(ushort)(uVar1 + 2),pIVar14->_vptr_IMmu,(ulong)(uVar1 + 2)
                          );
        local_398.field_2._M_allocated_capacity = (size_type)(uVar5 & 0xff);
        fmt.size_ = 0x22;
        fmt.data_ = (char *)0xe;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_398;
        local_398._M_dataplus._M_p = (char *)(ulong)uVar1;
        ::fmt::v8::vformat_abi_cxx11_(&local_330,(v8 *)"{:04X}  {:02X}",fmt,args_00);
        if (0xc < uVar8) {
          abort();
        }
        if ((0x1dfeU >> (uVar8 & 0x1f) & 1) == 0) {
          fmt_01.size_._4_4_ = 0;
          fmt_01._0_12_ = ZEXT812(6);
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)&local_3b8;
          ::fmt::v8::vformat_abi_cxx11_(&local_398,(v8 *)"      ",fmt_01,args_03);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_330,local_398._M_dataplus._M_p,local_398._M_string_length);
        }
        else {
          local_3b8._M_dataplus._M_p = (pointer)(ulong)(uVar6 & 0xff);
          fmt_00.size_ = 2;
          fmt_00.data_ = (char *)0x7;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&local_3b8;
          ::fmt::v8::vformat_abi_cxx11_(&local_398,(v8 *)0x12205f,fmt_00,args_01);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_330,local_398._M_dataplus._M_p,local_398._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((0xc3eU >> ((byte)uVar8 & 0x1f) & 1) == 0) {
            local_3b8._M_dataplus._M_p = (pointer)(ulong)(uVar7 & 0xff);
            fmt_02.size_ = 2;
            fmt_02.data_ = (char *)0x7;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)&local_3b8;
            ::fmt::v8::vformat_abi_cxx11_(&local_398,(v8 *)0x12205f,fmt_02,args_04);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_330,local_398._M_dataplus._M_p,local_398._M_string_length);
          }
          else {
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&local_3b8;
            ::fmt::v8::vformat_abi_cxx11_(&local_398,(v8 *)0x12206a,(string_view)ZEXT816(3),args_02)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_330,local_398._M_dataplus._M_p,local_398._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        family = (Family)local_300;
        pcVar18 = "*";
        if (family != NOP || (char)uVar9 == -0x16) {
          pcVar18 = " ";
          if ((char)uVar9 == -0x15) {
            pcVar18 = "*";
          }
          if (family - LAX < 8) {
            pcVar18 = "*";
          }
        }
        sVar20 = n_e_s::core::to_string(family);
        local_398.field_2._M_allocated_capacity = (size_type)sVar20._M_str;
        local_398.field_2._8_8_ = sVar20._M_len;
        fmt_03.size_ = 0xdc;
        fmt_03.data_ = (char *)0x5;
        args_05.field_1.args_ = in_R9.args_;
        args_05.desc_ = (unsigned_long_long)&local_398;
        local_398._M_dataplus._M_p = pcVar18;
        ::fmt::v8::vformat_abi_cxx11_(&local_3b8,(v8 *)" {}{}",fmt_03,args_05);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_330,local_3b8._M_dataplus._M_p,local_3b8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        uVar19 = local_2a8;
        pIVar14 = n_e_s::nes::Nes::mmu(&local_288);
        pCVar10 = n_e_s::nes::Nes::cpu_registers(&local_288);
        n_e_s::dis::get_memory_string_abi_cxx11_
                  (&local_3b8,(dis *)&local_2b8,(Opcode *)(uVar19 & 0xffff),(uint16_t)pIVar14,
                   (IMmu *)pCVar10,(CpuRegisters *)in_R9.values_);
        pCVar10 = n_e_s::nes::Nes::cpu_registers(&local_288);
        local_398._M_dataplus._M_p = (pointer)(ulong)pCVar10->a;
        local_398.field_2._M_allocated_capacity = (size_type)pCVar10->x;
        local_378 = (pointer)(ulong)pCVar10->y;
        local_368 = (ulong)pCVar10->p;
        local_358 = (ulong)pCVar10->sp;
        fmt_04.size_ = 0x22222;
        fmt_04.data_ = (char *)0x2d;
        args_06.field_1.values_ = in_R9.values_;
        args_06.desc_ = (unsigned_long_long)&local_398;
        ::fmt::v8::vformat_abi_cxx11_
                  (&local_2d8,(v8 *)"A:{:02X} X:{:02X} Y:{:02X} P:{:02X} SP:{:02X}",fmt_04,args_06);
        pIVar15 = n_e_s::nes::Nes::ppu(&local_288);
        uVar8 = (*pIVar15->_vptr_IPpu[7])(pIVar15);
        pIVar15 = n_e_s::nes::Nes::ppu(&local_288);
        uVar9 = (*pIVar15->_vptr_IPpu[6])(pIVar15);
        uVar16 = n_e_s::nes::Nes::current_cycle(&local_288);
        local_348 = uVar16 / 0xc + 7;
        local_368 = (ulong)((uVar8 & 0xffff) - 1);
        local_358 = (ulong)(uVar9 & 0xffff);
        local_398._M_dataplus._M_p = local_330._M_dataplus._M_p;
        local_398._M_string_length = local_330._M_string_length;
        local_398.field_2._M_allocated_capacity = (size_type)local_3b8._M_dataplus._M_p;
        local_398.field_2._8_8_ = local_3b8._M_string_length;
        local_378 = local_2d8._M_dataplus._M_p;
        sStack_370 = local_2d8._M_string_length;
        fmt_05.size_ = 0x421ddd;
        fmt_05.data_ = (char *)0x20;
        args_07.field_1.args_ = in_R9.args_;
        args_07.desc_ = (unsigned_long_long)&local_398;
        ::fmt::v8::vformat_abi_cxx11_
                  (&local_2f8,(v8 *)"{} {:<28}{} PPU:{:3},{:3} CYC:{}",fmt_05,args_07);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        uVar19 = local_308;
        lVar17 = local_310;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        local_398._M_dataplus._M_p = local_2f8._M_dataplus._M_p;
        local_398._M_string_length = local_2f8._M_string_length;
        args.field_1.values_ =
             (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_398;
        args.desc_ = 0xd;
        format_str.size_ = 3;
        format_str.data_ = "{}\n";
        ::fmt::v8::vprint(format_str,args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = (int)uVar19 - 1;
      uVar19 = (ulong)uVar8;
    } while (uVar8 != 0xfff0bdc0);
    std::ifstream::~ifstream(local_238);
    n_e_s::nes::Nes::~Nes(&local_288);
    iVar4 = 0;
  }
  else {
    format_str_00.size_ = 0x23;
    format_str_00.data_ = "Expected one argument; nestest.nes\n";
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_238;
    ::fmt::v8::vprint(_stderr,format_str_00,(format_args)(auVar3 << 0x40));
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 2) {
        fmt::print(stderr, "Expected one argument; nestest.nes\n");
        return 1;
    }

    try {
        n_e_s::nes::Nes nes;
        std::ifstream fs(argv[1], std::ios::binary);
        nes.load_rom(fs);
        nes.cpu_registers().pc = 0xC000;

        n_e_s::core::CpuState prev_state{};

        for (int i = 0; i < 1000000; ++i) {
            nes.execute();
            nes.execute();
            nes.execute();
            nes.execute();

            const auto state = nes.cpu().state();

            if (i == 0 || prev_state.start_cycle != state.start_cycle) {
                const std::string execution_string = get_execution_string(nes);
                fmt::print("{}\n", execution_string);

                prev_state = state;
            }
        }
    } catch (const std::exception &e) {
        fmt::print(stderr, "Expcetion: {}\n", e.what());
    }
}